

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptFunctionParameters(HlslGrammar *this,TFunction *function)

{
  HlslParseContext *pHVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  
  pHVar1 = this->parseContext;
  iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var,iVar4),
                  (((pHVar1->super_TParseContextBase).super_TParseVersions.intermediate)->
                  entryPointName)._M_dataplus._M_p);
  pHVar1->parsingEntrypointParameters = iVar4 == 0;
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (bVar2) {
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokVoid);
    if (!bVar2) {
      do {
        bVar2 = acceptParameterDeclaration(this,function);
        if (!bVar2) break;
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
      } while (bVar2);
    }
    bVar3 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    bVar2 = true;
    if (!bVar3) {
      bVar2 = false;
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,"Expected",")","");
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HlslGrammar::acceptFunctionParameters(TFunction& function)
{
    parseContext.beginParameterParsing(function);

    // LEFT_PAREN
    if (! acceptTokenClass(EHTokLeftParen))
        return false;

    // VOID RIGHT_PAREN
    if (! acceptTokenClass(EHTokVoid)) {
        do {
            // parameter_declaration
            if (! acceptParameterDeclaration(function))
                break;

            // COMMA
            if (! acceptTokenClass(EHTokComma))
                break;
        } while (true);
    }

    // RIGHT_PAREN
    if (! acceptTokenClass(EHTokRightParen)) {
        expected(")");
        return false;
    }

    return true;
}